

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_MockCheckedActualCall_unExpectedParameterName_TestShell::createTest
          (TEST_MockCheckedActualCall_unExpectedParameterName_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x20,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
                                  ,0x6c);
  this_00->_vptr_Utest = (_func_int **)0x0;
  this_00[1]._vptr_Utest = (_func_int **)0x0;
  this_00[2]._vptr_Utest = (_func_int **)0x0;
  this_00[3]._vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_002b0438;
  return this_00;
}

Assistant:

TEST(MockCheckedActualCall, unExpectedParameterName)
{
    MockCheckedExpectedCall call1;
    call1.withName("func");
    list->addExpectedCall(&call1);

    MockCheckedActualCall actualCall(1, reporter, *list);
    actualCall.withName("func").withParameter("integer", 1);

    MockNamedValue parameter("integer");
    parameter.setValue(1);

    MockUnexpectedInputParameterFailure expectedFailure(mockFailureTest(), "func", parameter, *list);
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}